

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<kj::String,_int>::Entry_&> __thiscall
kj::Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>
::find<0ul,kj::StringPtr&>
          (Table<kj::HashMap<kj::String,int>::Entry,kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>>
           *this,char (*params) [7])

{
  long lVar1;
  ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table;
  HashIndex<kj::HashMap<kj::String,int>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = params[4] + 4;
  table.size_ = *(size_t *)params;
  HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
  find<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
            (local_28,table,
             (char (*) [7])((long)(*(long *)(params[1] + 1) - *(size_t *)params) >> 5));
  if (local_28[0] == (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1) {
    lVar1 = local_20 * 0x20 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::HashMap<kj::String,_int>::Entry_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}